

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_Escape_Test::TestBody(FormatterTest_Escape_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  AssertHelper *this_00;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  char *in_stack_fffffffffffffc80;
  string *actual_expression;
  char *in_stack_fffffffffffffc88;
  int line;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  undefined8 in_stack_fffffffffffffc98;
  Type TVar5;
  AssertHelper *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  Message *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  string local_288 [32];
  AssertionResult local_268 [2];
  string local_248 [32];
  AssertionResult local_228 [2];
  string local_208 [32];
  AssertionResult local_1e8 [2];
  string local_1c8 [32];
  AssertionResult local_1a8 [2];
  string local_188 [32];
  AssertionResult local_168 [2];
  string local_148 [32];
  AssertionResult local_128 [2];
  string local_108 [32];
  AssertionResult local_e8 [2];
  string local_c8 [32];
  AssertionResult local_a8 [2];
  string local_88 [32];
  AssertionResult local_68 [3];
  string local_38 [32];
  AssertionResult local_18;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffc98 >> 0x20);
  fmt::v5::format<char[3]>
            ((char (*) [3])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [2])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12d1e7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12d24a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d2a2);
  fmt::v5::format<char[10]>
            ((char (*) [10])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [9])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12d38c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12d3ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d447);
  fmt::v5::format<char[9]>
            ((char (*) [9])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [8])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12d531);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12d594);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d5ec);
  fmt::v5::format<char[16]>
            ((char (*) [16])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[15],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [15])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12d6d6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),
               in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12d739);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d791);
  fmt::v5::format<char[3]>
            ((char (*) [3])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [2])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_148);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_128);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    in_stack_fffffffffffffce8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x12d87b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12d8de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d933);
  fmt::v5::format<char[10]>
            ((char (*) [10])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [9])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12da11);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12da6e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12dac3);
  fmt::v5::format<char[9]>
            ((char (*) [9])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [8])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_1c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    testing::AssertionResult::failure_message((AssertionResult *)0x12dba1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12dbfe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12dc53);
  fmt::v5::format<char[16]>
            ((char (*) [16])CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[15],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [15])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_208);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    in_stack_fffffffffffffca0 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12dd31);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,
               (char *)CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12dd8e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12dde3);
  TVar5 = (Type)((ulong)local_248 >> 0x20);
  fmt::v5::format<char[5]>((char (*) [5])CONCAT17(uVar3,in_stack_fffffffffffffca8));
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             (char (*) [3])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_248);
  uVar4 = testing::AssertionResult::operator_cast_to_bool(local_228);
  if (!(bool)uVar4) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    in_stack_fffffffffffffc88 =
         testing::AssertionResult::failure_message((AssertionResult *)0x12dec1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,(char *)CONCAT17(uVar4,in_stack_fffffffffffffc90),
               (int)((ulong)in_stack_fffffffffffffc88 >> 0x20),in_stack_fffffffffffffc80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc70);
    testing::Message::~Message((Message *)0x12df1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12df76);
  actual_expression = local_288;
  fmt::v5::format<char[8],int>
            ((char (*) [8])CONCAT17(uVar3,in_stack_fffffffffffffca8),
             (int *)in_stack_fffffffffffffca0);
  testing::internal::EqHelper<false>::Compare<char[5],std::__cxx11::string>
            (in_stack_fffffffffffffc88,(char *)actual_expression,
             (char (*) [5])CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             in_stack_fffffffffffffc70);
  line = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  std::__cxx11::string::~string(local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_268);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffca0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12e067)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffca0,TVar5,(char *)CONCAT17(uVar4,in_stack_fffffffffffffc90),
               line,(char *)actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffcf0),in_stack_fffffffffffffce8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x12e0c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12e119);
  return;
}

Assistant:

TEST(FormatterTest, Escape) {
  EXPECT_EQ("{", format("{{"));
  EXPECT_EQ("before {", format("before {{"));
  EXPECT_EQ("{ after", format("{{ after"));
  EXPECT_EQ("before { after", format("before {{ after"));

  EXPECT_EQ("}", format("}}"));
  EXPECT_EQ("before }", format("before }}"));
  EXPECT_EQ("} after", format("}} after"));
  EXPECT_EQ("before } after", format("before }} after"));

  EXPECT_EQ("{}", format("{{}}"));
  EXPECT_EQ("{42}", format("{{{0}}}", 42));
}